

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestCoverageHandler.cxx
# Opt level: O0

bool __thiscall
cmCTestCoverageHandler::GetNextInt
          (cmCTestCoverageHandler *this,string *inputLine,size_type *pos,int *value)

{
  int iVar1;
  undefined8 uVar2;
  char *__nptr;
  string local_58 [32];
  size_type local_38;
  size_type start;
  int *value_local;
  size_type *pos_local;
  string *inputLine_local;
  cmCTestCoverageHandler *this_local;
  
  local_38 = *pos;
  start = (size_type)value;
  value_local = (int *)pos;
  pos_local = (size_type *)inputLine;
  inputLine_local = (string *)this;
  uVar2 = std::__cxx11::string::find((char)inputLine,0x2c);
  *(undefined8 *)value_local = uVar2;
  std::__cxx11::string::substr((ulong)local_58,(ulong)pos_local);
  __nptr = (char *)std::__cxx11::string::c_str();
  iVar1 = atoi(__nptr);
  *(int *)start = iVar1;
  std::__cxx11::string::~string(local_58);
  if (*(long *)value_local != -1) {
    *(long *)value_local = *(long *)value_local + 1;
  }
  return true;
}

Assistant:

bool cmCTestCoverageHandler::GetNextInt(std::string const& inputLine,
                                        std::string::size_type& pos,
                                        int& value)
{
  std::string::size_type start = pos;
  pos = inputLine.find(',', start);
  value = atoi(inputLine.substr(start, pos).c_str());
  if (pos == std::string::npos) {
    return true;
  }
  pos++;
  return true;
}